

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# promise.h
# Opt level: O0

void __thiscall Promise::~Promise(Promise *this)

{
  Promise *this_local;
  
  this->_vptr_Promise = (_func_int **)&PTR_Tick_00117c50;
  std::vector<std::shared_ptr<Promise>,_std::allocator<std::shared_ptr<Promise>_>_>::~vector
            (&this->children);
  std::shared_ptr<Promise>::~shared_ptr(&this->parent);
  std::function<void_()>::~function(&this->auto_resolved_handler);
  std::function<void_(std::shared_ptr<Promise>)>::~function(&this->manually_resolved_handler);
  std::enable_shared_from_this<Promise>::~enable_shared_from_this
            (&this->super_enable_shared_from_this<Promise>);
  return;
}

Assistant:

~Promise() {
    DEBUG("Promise [%i] destroyed\n", id);
  }